

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O0

Slice __thiscall leveldb::anon_unknown_0::MergingIterator::key(MergingIterator *this)

{
  uint uVar1;
  Slice SVar2;
  MergingIterator *this_local;
  
  uVar1 = (*(this->super_Iterator)._vptr_Iterator[2])();
  if ((uVar1 & 1) == 0) {
    __assert_fail("Valid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/merger.cc"
                  ,0x6f,"virtual Slice leveldb::(anonymous namespace)::MergingIterator::key() const"
                 );
  }
  SVar2 = IteratorWrapper::key(this->current_);
  return SVar2;
}

Assistant:

Slice key() const override {
    assert(Valid());
    return current_->key();
  }